

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O1

int compute_set_matrix_2d(int set,float *azimuth,vbap_data *data)

{
  float *pfVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  float fVar9;
  
  bVar2 = data->sets[set].speakers[0];
  bVar3 = data->sets[set].speakers[1];
  dVar5 = cos(((double)azimuth[bVar2] * 6.283185307179586) / 360.0);
  dVar6 = sin(((double)azimuth[bVar2] * 6.283185307179586) / 360.0);
  dVar7 = cos(((double)azimuth[bVar3] * 6.283185307179586) / 360.0);
  dVar8 = sin(((double)azimuth[bVar3] * 6.283185307179586) / 360.0);
  fVar9 = (float)dVar5 * (float)dVar8 - (float)dVar6 * (float)dVar7;
  pfVar1 = data->sets[set].inv_mat;
  pfVar1[0] = 0.0;
  pfVar1[1] = 0.0;
  pfVar1[2] = 0.0;
  pfVar1[3] = 0.0;
  pfVar1 = data->sets[set].inv_mat;
  pfVar1[4] = 0.0;
  pfVar1[5] = 0.0;
  pfVar1[6] = 0.0;
  pfVar1[7] = 0.0;
  data->sets[set].inv_mat[8] = 0.0;
  bVar4 = 0.001 < ABS(fVar9);
  if (bVar4) {
    fVar9 = 1.0 / fVar9;
    data->sets[set].inv_mat[0] = (float)dVar8 * fVar9;
    data->sets[set].inv_mat[2] = (float)dVar7 * -fVar9;
    data->sets[set].inv_mat[3] = (float)dVar6 * -fVar9;
    data->sets[set].inv_mat[5] = fVar9 * (float)dVar5;
  }
  return (uint)bVar4;
}

Assistant:

int compute_set_matrix_2d(int set, float azimuth[], struct vbap_data *data){
  int i = data->sets[set].speakers[0];
  int j = data->sets[set].speakers[1];
  // TODO: I feel like it would be better to extract these from
  //       the positions instead of doing more trig, but I'll
  //       leave that for when it's actually tested.
  float x1 = cos(azimuth[i] * DEG2RAD);
  float x2 = sin(azimuth[i] * DEG2RAD);
  float x3 = cos(azimuth[j] * DEG2RAD);
  float x4 = sin(azimuth[j] * DEG2RAD);
  float det = (x1 * x4 - x3 * x2);

  memset(data->sets[set].inv_mat, 0, sizeof(float)*9);
  if(fabsf(det) <= 0.001){
    return 0;
  }
  
  float inv_det = 1.0 / det;
  // The matrix is constructed in such a way that the Y component of the input
  // vector is zeroed on multiplication. The matrix is in row-major format.
  data->sets[set].inv_mat[0] = x4 * +inv_det;
  data->sets[set].inv_mat[2] = x3 * -inv_det;
  data->sets[set].inv_mat[3] = x2 * -inv_det;
  data->sets[set].inv_mat[5] = x1 * +inv_det;
  return 1;
}